

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

int64 Time::microTicks(void)

{
  timespec ts;
  
  clock_gettime(1,(timespec *)&ts);
  return ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
}

Assistant:

int64 Time::microTicks()
{
#ifdef _WIN32
  LARGE_INTEGER li;
  VERIFY(QueryPerformanceCounter(&li));
  return li.QuadPart / Private::perfFreq;
#else
  struct timespec ts;
  clock_gettime(CLOCK_MONOTONIC, &ts);
  return (int64)ts.tv_sec * 1000000 + ts.tv_nsec / 1000;
#endif
}